

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_set_padding_mode(mbedtls_cipher_context_t *ctx,mbedtls_cipher_padding_t mode)

{
  mbedtls_cipher_padding_t mode_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if ((ctx == (mbedtls_cipher_context_t *)0x0) || (ctx->cipher_info->mode != MBEDTLS_MODE_CBC)) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    switch(mode) {
    case MBEDTLS_PADDING_PKCS7:
      ctx->add_padding = add_pkcs_padding;
      ctx->get_padding = get_pkcs_padding;
      break;
    case MBEDTLS_PADDING_ONE_AND_ZEROS:
      ctx->add_padding = add_one_and_zeros_padding;
      ctx->get_padding = get_one_and_zeros_padding;
      break;
    case MBEDTLS_PADDING_ZEROS_AND_LEN:
      ctx->add_padding = add_zeros_and_len_padding;
      ctx->get_padding = get_zeros_and_len_padding;
      break;
    case MBEDTLS_PADDING_ZEROS:
      ctx->add_padding = add_zeros_padding;
      ctx->get_padding = get_zeros_padding;
      break;
    case MBEDTLS_PADDING_NONE:
      ctx->add_padding = (_func_void_uchar_ptr_size_t_size_t *)0x0;
      ctx->get_padding = get_no_padding;
      break;
    default:
      return -0x6080;
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_set_padding_mode( mbedtls_cipher_context_t *ctx, mbedtls_cipher_padding_t mode )
{
    if( NULL == ctx ||
        MBEDTLS_MODE_CBC != ctx->cipher_info->mode )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

    switch( mode )
    {
#if defined(MBEDTLS_CIPHER_PADDING_PKCS7)
    case MBEDTLS_PADDING_PKCS7:
        ctx->add_padding = add_pkcs_padding;
        ctx->get_padding = get_pkcs_padding;
        break;
#endif
#if defined(MBEDTLS_CIPHER_PADDING_ONE_AND_ZEROS)
    case MBEDTLS_PADDING_ONE_AND_ZEROS:
        ctx->add_padding = add_one_and_zeros_padding;
        ctx->get_padding = get_one_and_zeros_padding;
        break;
#endif
#if defined(MBEDTLS_CIPHER_PADDING_ZEROS_AND_LEN)
    case MBEDTLS_PADDING_ZEROS_AND_LEN:
        ctx->add_padding = add_zeros_and_len_padding;
        ctx->get_padding = get_zeros_and_len_padding;
        break;
#endif
#if defined(MBEDTLS_CIPHER_PADDING_ZEROS)
    case MBEDTLS_PADDING_ZEROS:
        ctx->add_padding = add_zeros_padding;
        ctx->get_padding = get_zeros_padding;
        break;
#endif
    case MBEDTLS_PADDING_NONE:
        ctx->add_padding = NULL;
        ctx->get_padding = get_no_padding;
        break;

    default:
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }

    return( 0 );
}